

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O2

void __thiscall
soplex::
SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::flipAndUpdate(SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,int *nflips)

{
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  int iVar1;
  Status SVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar8;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  *pDVar9;
  undefined8 uVar10;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar11;
  undefined4 uVar14;
  undefined4 uVar15;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar12;
  pointer pBVar13;
  ulong uVar16;
  uint uVar17;
  type_conflict5 tVar18;
  int iVar19;
  long lVar20;
  double *pdVar21;
  long lVar22;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar23;
  pointer pnVar24;
  SPxOut *pSVar25;
  long lVar26;
  long lVar27;
  Status *pSVar28;
  uint *puVar29;
  pointer pnVar30;
  cpp_dec_float<200U,_int,_void> *pcVar31;
  uint *puVar32;
  cpp_dec_float<200U,_int,_void> *pcVar33;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar34;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar35;
  long lVar36;
  bool bVar37;
  byte bVar38;
  int local_f7c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  undefined4 local_ef4;
  long local_ef0;
  SPxId baseId;
  cpp_dec_float<200U,_int,_void> local_ec8;
  cpp_dec_float<200U,_int,_void> local_e48;
  cpp_dec_float<200U,_int,_void> local_dc8;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_d40;
  cpp_dec_float<200U,_int,_void> local_d38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_bb0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ab0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_930;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_830;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_730;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_630;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_530;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar38 = 0;
  this_00 = &this->updPrimRhs;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup(this_00);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(this_00,(((this->
                    super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .thesolver)->thecovectors->set).thenum);
  this_01 = &this->updPrimVec;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(this_01,(((this->
                    super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .thesolver)->thecovectors->set).thenum);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(this_00);
  local_d40 = this_01;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(this_01);
  lVar36 = 0;
  lVar26 = 0;
  local_f7c = 0;
  do {
    lVar27 = 0x1c;
    iVar1 = *nflips;
    if (iVar1 <= lVar26) {
      *nflips = iVar1 - local_f7c;
      if (iVar1 - local_f7c != 0 && local_f7c <= iVar1) {
        pSVar8 = (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .thesolver;
        bVar37 = pSVar8->theRep == ROW;
        uVar16 = (ulong)bVar37;
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::operator-=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      *)(&pSVar8->theFrhs)[(ulong)bVar37 * 2],this_00);
        pSVar8 = (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .thesolver;
        *(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          **)((pSVar8->instableLeaveVal).m_backend.data._M_elems + uVar16 * 8 + -0xf) = local_d40;
        *(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          **)((pSVar8->instableLeaveVal).m_backend.data._M_elems + uVar16 * 8 + -0xd) = this_00;
      }
      return;
    }
    iVar1 = *(int *)((long)(&((this->breakpoints).data.
                              super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                              ._M_impl.super__Vector_impl_data._M_start)->val + 1) + lVar36);
    lVar20 = (long)iVar1;
    if (lVar20 < 0) {
      local_f7c = local_f7c + 1;
    }
    else {
      local_ec8.fpclass = cpp_dec_float_finite;
      local_ec8.prec_elem = 0x1c;
      local_ec8.data._M_elems[0] = 0;
      local_ec8.data._M_elems[1] = 0;
      local_ec8.data._M_elems[2] = 0;
      local_ec8.data._M_elems[3] = 0;
      local_ec8.data._M_elems[4] = 0;
      local_ec8.data._M_elems[5] = 0;
      local_ec8.data._M_elems[6] = 0;
      local_ec8.data._M_elems[7] = 0;
      local_ec8.data._M_elems[8] = 0;
      local_ec8.data._M_elems[9] = 0;
      local_ec8.data._M_elems[10] = 0;
      local_ec8.data._M_elems[0xb] = 0;
      local_ec8.data._M_elems[0xc] = 0;
      local_ec8.data._M_elems[0xd] = 0;
      local_ec8.data._M_elems[0xe] = 0;
      local_ec8.data._M_elems[0xf] = 0;
      local_ec8.data._M_elems[0x18] = 0;
      local_ec8.data._M_elems[0x19] = 0;
      local_ec8.data._M_elems._104_5_ = 0;
      local_ec8.data._M_elems[0x1b]._1_3_ = 0;
      local_ec8.exp = 0;
      local_ec8.neg = false;
      local_ec8.data._M_elems[0x10] = 0;
      local_ec8.data._M_elems[0x11] = 0;
      local_ec8.data._M_elems[0x12] = 0;
      local_ec8.data._M_elems[0x13] = 0;
      local_ec8.data._M_elems[0x14] = 0;
      local_ec8.data._M_elems[0x15] = 0;
      local_ec8.data._M_elems[0x16] = 0;
      local_ec8.data._M_elems[0x17] = 0;
      local_dc8.fpclass = cpp_dec_float_finite;
      local_dc8.prec_elem = 0x1c;
      local_dc8.data._M_elems[0] = 0;
      local_dc8.data._M_elems[1] = 0;
      local_dc8.data._M_elems[2] = 0;
      local_dc8.data._M_elems[3] = 0;
      local_dc8.data._M_elems[4] = 0;
      local_dc8.data._M_elems[5] = 0;
      local_dc8.data._M_elems[6] = 0;
      local_dc8.data._M_elems[7] = 0;
      local_dc8.data._M_elems[8] = 0;
      local_dc8.data._M_elems[9] = 0;
      local_dc8.data._M_elems[10] = 0;
      local_dc8.data._M_elems[0xb] = 0;
      local_dc8.data._M_elems[0xc] = 0;
      local_dc8.data._M_elems[0xd] = 0;
      local_dc8.data._M_elems[0xe] = 0;
      local_dc8.data._M_elems[0xf] = 0;
      local_dc8.data._M_elems[0x10] = 0;
      local_dc8.data._M_elems[0x11] = 0;
      local_dc8.data._M_elems[0x12] = 0;
      local_dc8.data._M_elems[0x13] = 0;
      local_dc8.data._M_elems[0x18] = 0;
      local_dc8.data._M_elems[0x19] = 0;
      local_dc8.data._M_elems._104_5_ = 0;
      local_dc8.data._M_elems[0x1b]._1_3_ = 0;
      local_dc8.exp = 0;
      local_dc8.neg = false;
      local_dc8.data._M_elems[0x14] = 0;
      local_dc8.data._M_elems[0x15] = 0;
      local_dc8.data._M_elems[0x16] = 0;
      local_dc8.data._M_elems[0x17] = 0;
      local_e48.fpclass = cpp_dec_float_finite;
      local_e48.prec_elem = 0x1c;
      local_e48.data._M_elems[0] = 0;
      local_e48.data._M_elems[1] = 0;
      local_e48.data._M_elems[2] = 0;
      local_e48.data._M_elems[3] = 0;
      local_e48.data._M_elems[4] = 0;
      local_e48.data._M_elems[5] = 0;
      local_e48.data._M_elems[6] = 0;
      local_e48.data._M_elems[7] = 0;
      local_e48.data._M_elems[8] = 0;
      local_e48.data._M_elems[9] = 0;
      local_e48.data._M_elems[10] = 0;
      local_e48.data._M_elems[0xb] = 0;
      local_e48.data._M_elems[0xc] = 0;
      local_e48.data._M_elems[0xd] = 0;
      local_e48.data._M_elems[0xe] = 0;
      local_e48.data._M_elems[0xf] = 0;
      local_e48.data._M_elems[0x10] = 0;
      local_e48.data._M_elems[0x11] = 0;
      local_e48.data._M_elems[0x12] = 0;
      local_e48.data._M_elems[0x13] = 0;
      local_e48.data._M_elems[0x14] = 0;
      local_e48.data._M_elems[0x15] = 0;
      local_e48.data._M_elems[0x16] = 0;
      local_e48.data._M_elems[0x17] = 0;
      local_e48.data._M_elems[0x18] = 0;
      local_e48.data._M_elems[0x19] = 0;
      local_e48.data._M_elems._104_5_ = 0;
      local_e48.data._M_elems[0x1b]._1_3_ = 0;
      local_e48.exp = 0;
      local_e48.neg = false;
      local_ef0 = lVar26;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&local_d38,0.0,(type *)0x0);
      pSVar8 = (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .thesolver;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(&local_ec8,0);
      iVar19 = *(int *)((long)&((this->breakpoints).data.
                                super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                                ._M_impl.super__Vector_impl_data._M_start)->src + lVar36);
      if (iVar19 == -1) {
        pSVar11 = (this->
                  super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .thesolver;
        baseId.super_DataKey =
             (pSVar11->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).theBaseId.data[lVar20].super_DataKey;
        if (baseId.super_DataKey.info < 0) {
          SPxRowId::SPxRowId((SPxRowId *)&result.m_backend,&baseId);
          iVar19 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                   ::number(&(pSVar11->
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .
                             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .set,(DataKey *)&result.m_backend);
          pSVar28 = (pSVar8->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.rowstat.data;
          lVar22 = (long)iVar19;
          SVar2 = pSVar28[lVar22];
          pSVar8 = (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .thesolver;
          pnVar24 = (pSVar8->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .right.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar26 = 0x1c;
          pnVar30 = pnVar24 + lVar22;
          pcVar31 = &local_dc8;
          for (lVar27 = lVar26; lVar27 != 0; lVar27 = lVar27 + -1) {
            (pcVar31->data)._M_elems[0] = (pnVar30->m_backend).data._M_elems[0];
            pnVar30 = (pointer)((long)pnVar30 + ((ulong)bVar38 * -2 + 1) * 4);
            pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar38 * -8 + 4);
          }
          local_dc8.exp = pnVar24[lVar22].m_backend.exp;
          local_dc8.neg = pnVar24[lVar22].m_backend.neg;
          local_dc8.fpclass = pnVar24[lVar22].m_backend.fpclass;
          local_dc8.prec_elem = pnVar24[lVar22].m_backend.prec_elem;
          pnVar24 = (pSVar8->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pnVar30 = pnVar24 + lVar22;
          pcVar31 = &local_e48;
          for (; lVar26 != 0; lVar26 = lVar26 + -1) {
            (pcVar31->data)._M_elems[0] = (pnVar30->m_backend).data._M_elems[0];
            pnVar30 = (pointer)((long)pnVar30 + ((ulong)bVar38 * -2 + 1) * 4);
            pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar38 * -8 + 4);
          }
          local_e48.exp = pnVar24[lVar22].m_backend.exp;
          local_e48.neg = pnVar24[lVar22].m_backend.neg;
          local_e48.fpclass = pnVar24[lVar22].m_backend.fpclass;
          local_e48.prec_elem = pnVar24[lVar22].m_backend.prec_elem;
          if (SVar2 == P_ON_LOWER) goto LAB_0045b115;
          if (SVar2 == P_ON_UPPER) goto LAB_0045add6;
          pSVar25 = pSVar8->spxout;
          if (pSVar25 == (SPxOut *)0x0) goto LAB_0045beb4;
          if (0 < (int)pSVar25->m_verbosity) {
            result.m_backend.data._M_elems[0] = pSVar25->m_verbosity;
            local_ef4 = 1;
            (*pSVar25->_vptr_SPxOut[2])(pSVar25,&local_ef4);
            pSVar25 = soplex::operator<<(((this->
                                          super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ).
                                          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         .thesolver)->spxout,"unexpected basis status: ");
            pSVar25 = soplex::operator<<(pSVar25,SVar2);
            pSVar25 = soplex::operator<<(pSVar25," index: ");
            pSVar25 = soplex::operator<<(pSVar25,iVar1);
            pSVar25 = soplex::operator<<(pSVar25," val: ");
            pnVar24 = (((this->
                        super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .thesolver)->theFvec->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar26 = 0x1c;
            pnVar30 = pnVar24 + lVar20;
            pnVar34 = &local_830;
            for (lVar27 = lVar26; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pnVar34->m_backend).data._M_elems[0] = *(uint *)&pnVar30->m_backend;
              pnVar30 = (pointer)((long)pnVar30 + ((ulong)bVar38 * -2 + 1) * 4);
              pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar34 + ((ulong)bVar38 * -2 + 1) * 4);
            }
            local_830.m_backend.exp = pnVar24[lVar20].m_backend.exp;
            local_830.m_backend.neg = pnVar24[lVar20].m_backend.neg;
            local_830.m_backend.fpclass = pnVar24[lVar20].m_backend.fpclass;
            local_830.m_backend.prec_elem = pnVar24[lVar20].m_backend.prec_elem;
            pSVar25 = soplex::operator<<(pSVar25,&local_830);
            pSVar25 = soplex::operator<<(pSVar25," upd: ");
            SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::operator[](&local_1b0,
                         &((this->
                           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .thesolver)->theFvec->thedelta,iVar1);
            pSVar25 = soplex::operator<<(pSVar25,&local_1b0);
            pSVar25 = soplex::operator<<(pSVar25," lower: ");
            pcVar31 = &local_e48;
            pnVar34 = &local_8b0;
            for (lVar27 = lVar26; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pnVar34->m_backend).data._M_elems[0] = (pcVar31->data)._M_elems[0];
              pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar31 + ((ulong)bVar38 * -2 + 1) * 4);
              pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar34 + ((ulong)bVar38 * -2 + 1) * 4);
            }
            local_8b0.m_backend.exp = local_e48.exp;
            local_8b0.m_backend.neg = local_e48.neg;
            local_8b0.m_backend.fpclass = local_e48.fpclass;
            local_8b0.m_backend.prec_elem = local_e48.prec_elem;
            pSVar25 = soplex::operator<<(pSVar25,&local_8b0);
            pSVar25 = soplex::operator<<(pSVar25," upper: ");
            pcVar31 = &local_dc8;
            pnVar34 = &local_930;
            for (lVar27 = lVar26; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pnVar34->m_backend).data._M_elems[0] = (pcVar31->data)._M_elems[0];
              pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar31 + ((ulong)bVar38 * -2 + 1) * 4);
              pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar34 + ((ulong)bVar38 * -2 + 1) * 4);
            }
            local_930.m_backend.exp = local_dc8.exp;
            local_930.m_backend.neg = local_dc8.neg;
            local_930.m_backend.fpclass = local_dc8.fpclass;
            local_930.m_backend.prec_elem = local_dc8.prec_elem;
            pSVar25 = soplex::operator<<(pSVar25,&local_930);
            pSVar25 = soplex::operator<<(pSVar25," bp.val: ");
            pBVar13 = (this->breakpoints).data.
                      super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar34 = &local_9b0;
            puVar32 = (uint *)((long)(pBVar13->val).m_backend.data._M_elems + lVar36);
            pnVar35 = pnVar34;
            for (; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pnVar35->m_backend).data._M_elems[0] = *puVar32;
              puVar32 = puVar32 + (ulong)bVar38 * -2 + 1;
              pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar35 + ((ulong)bVar38 * -2 + 1) * 4);
            }
            local_9b0.m_backend.exp = *(int *)((long)(&(pBVar13->val).m_backend.data + 1) + lVar36);
            local_9b0.m_backend.neg =
                 *(bool *)((long)(&(pBVar13->val).m_backend.data + 1) + lVar36 + 4U);
            local_9b0.m_backend._120_8_ =
                 *(undefined8 *)((long)(&(pBVar13->val).m_backend.data + 1) + lVar36 + 8U);
            goto LAB_0045be78;
          }
LAB_0045bed6:
          local_f7c = local_f7c + 1;
        }
        else {
          SPxColId::SPxColId((SPxColId *)&result.m_backend,&baseId);
          iVar19 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                   ::number(&(pSVar11->
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .
                             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .set,(DataKey *)&result.m_backend);
          pSVar28 = (pSVar8->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.colstat.data;
          lVar22 = (long)iVar19;
          SVar2 = pSVar28[lVar22];
          pSVar8 = (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .thesolver;
          pnVar24 = (pSVar8->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar26 = 0x1c;
          pnVar30 = pnVar24 + lVar22;
          pcVar31 = &local_dc8;
          for (lVar27 = lVar26; lVar27 != 0; lVar27 = lVar27 + -1) {
            (pcVar31->data)._M_elems[0] = (pnVar30->m_backend).data._M_elems[0];
            pnVar30 = (pointer)((long)pnVar30 + ((ulong)bVar38 * -2 + 1) * 4);
            pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar38 * -8 + 4);
          }
          local_dc8.exp = pnVar24[lVar22].m_backend.exp;
          local_dc8.neg = pnVar24[lVar22].m_backend.neg;
          local_dc8.fpclass = pnVar24[lVar22].m_backend.fpclass;
          local_dc8.prec_elem = pnVar24[lVar22].m_backend.prec_elem;
          pnVar24 = (pSVar8->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pnVar30 = pnVar24 + lVar22;
          pcVar31 = &local_e48;
          for (; lVar26 != 0; lVar26 = lVar26 + -1) {
            (pcVar31->data)._M_elems[0] = (pnVar30->m_backend).data._M_elems[0];
            pnVar30 = (pointer)((long)pnVar30 + ((ulong)bVar38 * -2 + 1) * 4);
            pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar38 * -8 + 4);
          }
          local_e48.exp = pnVar24[lVar22].m_backend.exp;
          local_e48.neg = pnVar24[lVar22].m_backend.neg;
          local_e48.fpclass = pnVar24[lVar22].m_backend.fpclass;
          local_e48.prec_elem = pnVar24[lVar22].m_backend.prec_elem;
          if (SVar2 == P_ON_LOWER) {
LAB_0045b115:
            pSVar28[lVar22] = P_ON_UPPER;
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 0x1c;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems[8] = 0;
            result.m_backend.data._M_elems[9] = 0;
            result.m_backend.data._M_elems[10] = 0;
            result.m_backend.data._M_elems[0xb] = 0;
            result.m_backend.data._M_elems[0xc] = 0;
            result.m_backend.data._M_elems[0xd] = 0;
            result.m_backend.data._M_elems[0xe] = 0;
            result.m_backend.data._M_elems[0xf] = 0;
            result.m_backend.data._M_elems[0x10] = 0;
            result.m_backend.data._M_elems[0x11] = 0;
            result.m_backend.data._M_elems[0x12] = 0;
            result.m_backend.data._M_elems[0x13] = 0;
            result.m_backend.data._M_elems[0x14] = 0;
            result.m_backend.data._M_elems[0x15] = 0;
            result.m_backend.data._M_elems[0x16] = 0;
            result.m_backend.data._M_elems[0x17] = 0;
            result.m_backend.data._M_elems[0x18] = 0;
            result.m_backend.data._M_elems[0x19] = 0;
            result.m_backend.data._M_elems._104_5_ = 0;
            result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result.m_backend,&local_e48,&local_dc8);
            pcVar31 = &result.m_backend;
            pcVar33 = &local_ec8;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pcVar33->data)._M_elems[0] = (pcVar31->data)._M_elems[0];
              pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar38 * -8 + 4);
              pcVar33 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar33 + (ulong)bVar38 * -8 + 4);
            }
            local_ec8.exp = result.m_backend.exp;
            local_ec8.neg = result.m_backend.neg;
            local_ec8.fpclass = result.m_backend.fpclass;
            local_ec8.prec_elem = result.m_backend.prec_elem;
            pSVar8 = (this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .thesolver;
            pnVar24 = (pSVar8->theUBbound).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar20;
            iVar19 = *(int *)&(pnVar24->m_backend).data;
            lVar26 = 0x1b;
            puVar32 = (pnVar24->m_backend).data._M_elems + 1;
            pcVar31 = &result.m_backend;
            for (lVar27 = lVar26; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pcVar31->data)._M_elems[0] = *puVar32;
              puVar32 = puVar32 + (ulong)bVar38 * -2 + 1;
              pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar38 * -8 + 4);
            }
            iVar5 = (pnVar24->m_backend).exp;
            pnVar30 = (pSVar8->theLBbound).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar20;
            uVar7 = (pnVar24->m_backend).fpclass;
            uVar15 = (pnVar24->m_backend).prec_elem;
            bVar37 = (pnVar24->m_backend).neg;
            *(int *)&(pnVar30->m_backend).data = iVar19;
            pcVar31 = &result.m_backend;
            puVar32 = (pnVar30->m_backend).data._M_elems + 1;
            for (; lVar26 != 0; lVar26 = lVar26 + -1) {
              *puVar32 = (pcVar31->data)._M_elems[0];
              pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar38 * -8 + 4);
              puVar32 = puVar32 + (ulong)bVar38 * -2 + 1;
            }
            (pnVar30->m_backend).exp = iVar5;
            (pnVar30->m_backend).neg = (bool)((iVar19 != 0 || uVar7 != 0) ^ bVar37);
            (pnVar30->m_backend).fpclass = uVar7;
            (pnVar30->m_backend).prec_elem = uVar15;
            pdVar21 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      (&result.m_backend,*pdVar21,(type *)0x0);
            pnVar24 = (((this->
                        super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .thesolver)->theUBbound).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            if (SVar2 != P_ON_UPPER) {
              pSVar25 = pSVar8->spxout;
              if (pSVar25 == (SPxOut *)0x0) {
LAB_0045beb4:
                local_f7c = local_f7c + 1;
              }
              else {
                if ((int)pSVar25->m_verbosity < 1) goto LAB_0045bed6;
                result.m_backend.data._M_elems[0] = pSVar25->m_verbosity;
                local_ef4 = 1;
                (*pSVar25->_vptr_SPxOut[2])(pSVar25,&local_ef4);
                pSVar25 = soplex::operator<<(((this->
                                              super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              ).
                                              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             .thesolver)->spxout,"FVEC unexpected status: ");
                pSVar25 = soplex::operator<<(pSVar25,SVar2);
                pSVar25 = soplex::operator<<(pSVar25," index: ");
                pSVar25 = soplex::operator<<(pSVar25,iVar1);
                pSVar25 = soplex::operator<<(pSVar25," val: ");
                pnVar24 = (((this->
                            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .thesolver)->theFvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                lVar26 = 0x1c;
                pnVar30 = pnVar24 + lVar20;
                pnVar34 = &local_a30;
                for (lVar27 = lVar26; lVar27 != 0; lVar27 = lVar27 + -1) {
                  (pnVar34->m_backend).data._M_elems[0] = *(uint *)&pnVar30->m_backend;
                  pnVar30 = (pointer)((long)pnVar30 + ((ulong)bVar38 * -2 + 1) * 4);
                  pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar34 + ((ulong)bVar38 * -2 + 1) * 4);
                }
                local_a30.m_backend.exp = pnVar24[lVar20].m_backend.exp;
                local_a30.m_backend.neg = pnVar24[lVar20].m_backend.neg;
                local_a30.m_backend.fpclass = pnVar24[lVar20].m_backend.fpclass;
                local_a30.m_backend.prec_elem = pnVar24[lVar20].m_backend.prec_elem;
                pSVar25 = soplex::operator<<(pSVar25,&local_a30);
                pSVar25 = soplex::operator<<(pSVar25," upd: ");
                SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[](&local_230,
                             &((this->
                               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .thesolver)->theFvec->thedelta,iVar1);
                pSVar25 = soplex::operator<<(pSVar25,&local_230);
                pSVar25 = soplex::operator<<(pSVar25," lower: ");
                pcVar31 = &local_e48;
                pnVar34 = &local_ab0;
                for (lVar27 = lVar26; lVar27 != 0; lVar27 = lVar27 + -1) {
                  (pnVar34->m_backend).data._M_elems[0] = (pcVar31->data)._M_elems[0];
                  pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar31 + ((ulong)bVar38 * -2 + 1) * 4);
                  pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar34 + ((ulong)bVar38 * -2 + 1) * 4);
                }
                local_ab0.m_backend.exp = local_e48.exp;
                local_ab0.m_backend.neg = local_e48.neg;
                local_ab0.m_backend.fpclass = local_e48.fpclass;
                local_ab0.m_backend.prec_elem = local_e48.prec_elem;
                pSVar25 = soplex::operator<<(pSVar25,&local_ab0);
                pSVar25 = soplex::operator<<(pSVar25," upper: ");
                pcVar31 = &local_dc8;
                pnVar34 = &local_b30;
                for (lVar27 = lVar26; lVar27 != 0; lVar27 = lVar27 + -1) {
                  (pnVar34->m_backend).data._M_elems[0] = (pcVar31->data)._M_elems[0];
                  pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar31 + ((ulong)bVar38 * -2 + 1) * 4);
                  pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar34 + ((ulong)bVar38 * -2 + 1) * 4);
                }
                local_b30.m_backend.exp = local_dc8.exp;
                local_b30.m_backend.neg = local_dc8.neg;
                local_b30.m_backend.fpclass = local_dc8.fpclass;
                local_b30.m_backend.prec_elem = local_dc8.prec_elem;
                pSVar25 = soplex::operator<<(pSVar25,&local_b30);
                pSVar25 = soplex::operator<<(pSVar25," bp.val: ");
                pBVar13 = (this->breakpoints).data.
                          super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pnVar34 = &local_bb0;
                puVar32 = (uint *)((long)(pBVar13->val).m_backend.data._M_elems + lVar36);
                pnVar35 = pnVar34;
                for (; lVar26 != 0; lVar26 = lVar26 + -1) {
                  (pnVar35->m_backend).data._M_elems[0] = *puVar32;
                  puVar32 = puVar32 + (ulong)bVar38 * -2 + 1;
                  pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar35 + ((ulong)bVar38 * -2 + 1) * 4);
                }
                local_bb0.m_backend.exp =
                     *(int *)((long)(&(pBVar13->val).m_backend.data + 1) + lVar36);
                local_bb0.m_backend.neg =
                     *(bool *)((long)(&(pBVar13->val).m_backend.data + 1) + lVar36 + 4U);
                local_bb0.m_backend._120_8_ =
                     *(undefined8 *)((long)(&(pBVar13->val).m_backend.data + 1) + lVar36 + 8U);
LAB_0045be78:
                local_f7c = local_f7c + 1;
                pSVar25 = soplex::operator<<(pSVar25,pnVar34);
                std::endl<char,std::char_traits<char>>(pSVar25->m_streams[pSVar25->m_verbosity]);
                pSVar25 = ((this->
                           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .thesolver)->spxout;
                (*pSVar25->_vptr_SPxOut[2])(pSVar25,&result);
              }
              goto LAB_0045b278;
            }
LAB_0045add6:
            pSVar28[lVar22] = P_ON_LOWER;
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 0x1c;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems[8] = 0;
            result.m_backend.data._M_elems[9] = 0;
            result.m_backend.data._M_elems[10] = 0;
            result.m_backend.data._M_elems[0xb] = 0;
            result.m_backend.data._M_elems[0xc] = 0;
            result.m_backend.data._M_elems[0xd] = 0;
            result.m_backend.data._M_elems[0xe] = 0;
            result.m_backend.data._M_elems[0xf] = 0;
            result.m_backend.data._M_elems[0x10] = 0;
            result.m_backend.data._M_elems[0x11] = 0;
            result.m_backend.data._M_elems[0x12] = 0;
            result.m_backend.data._M_elems[0x13] = 0;
            result.m_backend.data._M_elems[0x14] = 0;
            result.m_backend.data._M_elems[0x15] = 0;
            result.m_backend.data._M_elems[0x16] = 0;
            result.m_backend.data._M_elems[0x17] = 0;
            result.m_backend.data._M_elems[0x18] = 0;
            result.m_backend.data._M_elems[0x19] = 0;
            result.m_backend.data._M_elems._104_5_ = 0;
            result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result.m_backend,&local_dc8,&local_e48);
            pcVar31 = &result.m_backend;
            pcVar33 = &local_ec8;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pcVar33->data)._M_elems[0] = (pcVar31->data)._M_elems[0];
              pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar38 * -8 + 4);
              pcVar33 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar33 + (ulong)bVar38 * -8 + 4);
            }
            local_ec8.exp = result.m_backend.exp;
            local_ec8.neg = result.m_backend.neg;
            local_ec8.fpclass = result.m_backend.fpclass;
            local_ec8.prec_elem = result.m_backend.prec_elem;
            pSVar8 = (this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .thesolver;
            pnVar24 = (pSVar8->theLBbound).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar20;
            iVar19 = *(int *)&(pnVar24->m_backend).data;
            lVar26 = 0x1b;
            puVar32 = (pnVar24->m_backend).data._M_elems + 1;
            pcVar31 = &result.m_backend;
            for (lVar27 = lVar26; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pcVar31->data)._M_elems[0] = *puVar32;
              puVar32 = puVar32 + (ulong)bVar38 * -2 + 1;
              pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar38 * -8 + 4);
            }
            iVar5 = (pnVar24->m_backend).exp;
            pnVar30 = (pSVar8->theUBbound).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar20;
            uVar6 = (pnVar24->m_backend).fpclass;
            uVar14 = (pnVar24->m_backend).prec_elem;
            bVar37 = (pnVar24->m_backend).neg;
            *(int *)&(pnVar30->m_backend).data = iVar19;
            pcVar31 = &result.m_backend;
            puVar32 = (pnVar30->m_backend).data._M_elems + 1;
            for (; lVar26 != 0; lVar26 = lVar26 + -1) {
              *puVar32 = (pcVar31->data)._M_elems[0];
              pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar38 * -8 + 4);
              puVar32 = puVar32 + (ulong)bVar38 * -2 + 1;
            }
            (pnVar30->m_backend).exp = iVar5;
            (pnVar30->m_backend).neg = (bool)((iVar19 != 0 || uVar6 != 0) ^ bVar37);
            (pnVar30->m_backend).fpclass = uVar6;
            (pnVar30->m_backend).prec_elem = uVar14;
            pdVar21 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      (&result.m_backend,-*pdVar21,(type *)0x0);
            pnVar24 = (((this->
                        super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .thesolver)->theLBbound).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          pcVar31 = &result.m_backend;
          pnVar30 = pnVar24 + lVar20;
          for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
            (pnVar30->m_backend).data._M_elems[0] = (pcVar31->data)._M_elems[0];
            pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar38 * -8 + 4);
            pnVar30 = (pointer)((long)pnVar30 + ((ulong)bVar38 * -2 + 1) * 4);
          }
          pnVar24[lVar20].m_backend.exp = result.m_backend.exp;
          pnVar24[lVar20].m_backend.neg = result.m_backend.neg;
          pnVar24[lVar20].m_backend.fpclass = result.m_backend.fpclass;
          pnVar24[lVar20].m_backend.prec_elem = result.m_backend.prec_elem;
        }
LAB_0045b278:
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[](&result,&((this->
                               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .thesolver)->theFvec->thedelta,iVar1);
        pcVar31 = &local_ec8;
        pnVar34 = &local_c30;
        for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
          (pnVar34->m_backend).data._M_elems[0] = (pcVar31->data)._M_elems[0];
          pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + ((ulong)bVar38 * -2 + 1) * 4)
          ;
          pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar34 + ((ulong)bVar38 * -2 + 1) * 4);
        }
        local_c30.m_backend.exp = local_ec8.exp;
        local_c30.m_backend.neg = local_ec8.neg;
        local_c30.m_backend.fpclass = local_ec8.fpclass;
        local_c30.m_backend.prec_elem = local_ec8.prec_elem;
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add(this_00,iVar1,&local_c30);
        lVar26 = local_ef0;
      }
      else if (iVar19 == 1) {
        pDVar9 = (pSVar8->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thedesc.costat;
        SVar2 = pDVar9->data[lVar20];
        pSVar8 = (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .thesolver;
        pnVar24 = (pSVar8->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar30 = pnVar24 + lVar20;
        pcVar31 = &local_dc8;
        for (lVar26 = lVar27; lVar26 != 0; lVar26 = lVar26 + -1) {
          (pcVar31->data)._M_elems[0] = (pnVar30->m_backend).data._M_elems[0];
          pnVar30 = (pointer)((long)pnVar30 + ((ulong)bVar38 * -2 + 1) * 4);
          pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar38 * -8 + 4);
        }
        local_dc8.exp = pnVar24[lVar20].m_backend.exp;
        local_dc8.neg = pnVar24[lVar20].m_backend.neg;
        local_dc8.fpclass = pnVar24[lVar20].m_backend.fpclass;
        local_dc8.prec_elem = pnVar24[lVar20].m_backend.prec_elem;
        pnVar24 = (pSVar8->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .left.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar30 = pnVar24 + lVar20;
        pcVar31 = &local_e48;
        for (lVar26 = lVar27; lVar26 != 0; lVar26 = lVar26 + -1) {
          (pcVar31->data)._M_elems[0] = (pnVar30->m_backend).data._M_elems[0];
          pnVar30 = (pointer)((long)pnVar30 + ((ulong)bVar38 * -2 + 1) * 4);
          pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar38 * -8 + 4);
        }
        local_e48.exp = pnVar24[lVar20].m_backend.exp;
        local_e48.neg = pnVar24[lVar20].m_backend.neg;
        local_e48.fpclass = pnVar24[lVar20].m_backend.fpclass;
        local_e48.prec_elem = pnVar24[lVar20].m_backend.prec_elem;
        if (SVar2 == P_ON_LOWER) {
          pDVar9->data[lVar20] = P_ON_UPPER;
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 0x1c;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems[6] = 0;
          result.m_backend.data._M_elems[7] = 0;
          result.m_backend.data._M_elems[8] = 0;
          result.m_backend.data._M_elems[9] = 0;
          result.m_backend.data._M_elems[10] = 0;
          result.m_backend.data._M_elems[0xb] = 0;
          result.m_backend.data._M_elems[0xc] = 0;
          result.m_backend.data._M_elems[0xd] = 0;
          result.m_backend.data._M_elems[0xe] = 0;
          result.m_backend.data._M_elems[0xf] = 0;
          result.m_backend.data._M_elems[0x10] = 0;
          result.m_backend.data._M_elems[0x11] = 0;
          result.m_backend.data._M_elems[0x12] = 0;
          result.m_backend.data._M_elems[0x13] = 0;
          result.m_backend.data._M_elems[0x14] = 0;
          result.m_backend.data._M_elems[0x15] = 0;
          result.m_backend.data._M_elems[0x16] = 0;
          result.m_backend.data._M_elems[0x17] = 0;
          result.m_backend.data._M_elems[0x18] = 0;
          result.m_backend.data._M_elems[0x19] = 0;
          result.m_backend.data._M_elems._104_5_ = 0;
          result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result.m_backend,&local_dc8,&local_e48);
          pcVar31 = &result.m_backend;
          pcVar33 = &local_ec8;
          for (; lVar27 != 0; lVar27 = lVar27 + -1) {
            (pcVar33->data)._M_elems[0] = (pcVar31->data)._M_elems[0];
            pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar38 * -8 + 4);
            pcVar33 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar33 + (ulong)bVar38 * -8 + 4);
          }
          local_ec8.exp = result.m_backend.exp;
          local_ec8.neg = result.m_backend.neg;
          local_ec8.fpclass = result.m_backend.fpclass;
          local_ec8.prec_elem = result.m_backend.prec_elem;
          pSVar8 = (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .thesolver;
          puVar32 = (pSVar8->theCoUbound->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar20].m_backend.data._M_elems + 1;
          uVar3 = ((array_type *)(puVar32 + -1))->_M_elems[0];
          lVar26 = 0x1b;
          puVar29 = puVar32;
          pcVar31 = &result.m_backend;
          for (lVar27 = lVar26; lVar27 != 0; lVar27 = lVar27 + -1) {
            (pcVar31->data)._M_elems[0] = *puVar29;
            puVar29 = puVar29 + (ulong)bVar38 * -2 + 1;
            pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar38 * -8 + 4);
          }
          uVar4 = puVar32[0x1b];
          pnVar24 = (pSVar8->theCoLbound->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar20;
          uVar10 = *(undefined8 *)(puVar32 + 0x1d);
          uVar17 = puVar32[0x1c];
          (pnVar24->m_backend).data._M_elems[0] = uVar3;
          pcVar31 = &result.m_backend;
          puVar32 = (pnVar24->m_backend).data._M_elems + 1;
          for (; lVar26 != 0; lVar26 = lVar26 + -1) {
            *puVar32 = (pcVar31->data)._M_elems[0];
            pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar38 * -8 + 4);
            puVar32 = puVar32 + (ulong)bVar38 * -2 + 1;
          }
          (pnVar24->m_backend).exp = uVar4;
          (pnVar24->m_backend).neg = (bool)((uVar3 != 0 || (int)uVar10 != 0) ^ (byte)uVar17);
          (pnVar24->m_backend).fpclass = (int)uVar10;
          (pnVar24->m_backend).prec_elem = (int)((ulong)uVar10 >> 0x20);
          pdVar21 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (&result.m_backend,*pdVar21,(type *)0x0);
          pnVar24 = (((this->
                      super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .thesolver)->theCoUbound->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pcVar31 = &result.m_backend;
          pnVar30 = pnVar24 + lVar20;
          for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
            (pnVar30->m_backend).data._M_elems[0] = (pcVar31->data)._M_elems[0];
            pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar38 * -8 + 4);
            pnVar30 = (pointer)((long)pnVar30 + ((ulong)bVar38 * -2 + 1) * 4);
          }
          pnVar24[lVar20].m_backend.exp = result.m_backend.exp;
          pnVar24[lVar20].m_backend.neg = result.m_backend.neg;
          pnVar24[lVar20].m_backend.fpclass = result.m_backend.fpclass;
          pnVar24[lVar20].m_backend.prec_elem = result.m_backend.prec_elem;
          pVVar23 = ((this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .thesolver)->theCoLbound;
LAB_0045b086:
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 0x1c;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems[6] = 0;
          result.m_backend.data._M_elems[7] = 0;
          result.m_backend.data._M_elems[8] = 0;
          result.m_backend.data._M_elems[9] = 0;
          result.m_backend.data._M_elems[10] = 0;
          result.m_backend.data._M_elems[0xb] = 0;
          result.m_backend.data._M_elems[0xc] = 0;
          result.m_backend.data._M_elems[0xd] = 0;
          result.m_backend.data._M_elems[0xe] = 0;
          result.m_backend.data._M_elems[0xf] = 0;
          result.m_backend.data._M_elems[0x10] = 0;
          result.m_backend.data._M_elems[0x11] = 0;
          result.m_backend.data._M_elems[0x12] = 0;
          result.m_backend.data._M_elems[0x13] = 0;
          result.m_backend.data._M_elems[0x14] = 0;
          result.m_backend.data._M_elems[0x15] = 0;
          result.m_backend.data._M_elems[0x16] = 0;
          result.m_backend.data._M_elems[0x17] = 0;
          result.m_backend.data._M_elems[0x18] = 0;
          result.m_backend.data._M_elems[0x19] = 0;
          result.m_backend.data._M_elems._104_5_ = 0;
          result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result.m_backend,&local_ec8,
                     &(pVVar23->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar20].m_backend);
          pcVar31 = &result.m_backend;
          pcVar33 = &local_d38;
          for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
            (pcVar33->data)._M_elems[0] = (pcVar31->data)._M_elems[0];
            pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar38 * -8 + 4);
            pcVar33 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar33 + ((ulong)bVar38 * -2 + 1) * 4);
          }
          local_d38.exp = result.m_backend.exp;
          local_d38.neg = result.m_backend.neg;
          local_d38.fpclass = result.m_backend.fpclass;
          local_d38.prec_elem = result.m_backend.prec_elem;
        }
        else {
          if (SVar2 == P_ON_UPPER) {
            pDVar9->data[lVar20] = P_ON_LOWER;
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 0x1c;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems[8] = 0;
            result.m_backend.data._M_elems[9] = 0;
            result.m_backend.data._M_elems[10] = 0;
            result.m_backend.data._M_elems[0xb] = 0;
            result.m_backend.data._M_elems[0xc] = 0;
            result.m_backend.data._M_elems[0xd] = 0;
            result.m_backend.data._M_elems[0xe] = 0;
            result.m_backend.data._M_elems[0xf] = 0;
            result.m_backend.data._M_elems[0x10] = 0;
            result.m_backend.data._M_elems[0x11] = 0;
            result.m_backend.data._M_elems[0x12] = 0;
            result.m_backend.data._M_elems[0x13] = 0;
            result.m_backend.data._M_elems[0x14] = 0;
            result.m_backend.data._M_elems[0x15] = 0;
            result.m_backend.data._M_elems[0x16] = 0;
            result.m_backend.data._M_elems[0x17] = 0;
            result.m_backend.data._M_elems[0x18] = 0;
            result.m_backend.data._M_elems[0x19] = 0;
            result.m_backend.data._M_elems._104_5_ = 0;
            result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result.m_backend,&local_e48,&local_dc8);
            pcVar31 = &result.m_backend;
            pcVar33 = &local_ec8;
            for (; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pcVar33->data)._M_elems[0] = (pcVar31->data)._M_elems[0];
              pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar38 * -8 + 4);
              pcVar33 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar33 + (ulong)bVar38 * -8 + 4);
            }
            local_ec8.exp = result.m_backend.exp;
            local_ec8.neg = result.m_backend.neg;
            local_ec8.fpclass = result.m_backend.fpclass;
            local_ec8.prec_elem = result.m_backend.prec_elem;
            pSVar8 = (this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .thesolver;
            puVar32 = (pSVar8->theCoLbound->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar20].m_backend.data._M_elems + 1;
            uVar3 = ((array_type *)(puVar32 + -1))->_M_elems[0];
            lVar26 = 0x1b;
            puVar29 = puVar32;
            pcVar31 = &result.m_backend;
            for (lVar27 = lVar26; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pcVar31->data)._M_elems[0] = *puVar29;
              puVar29 = puVar29 + (ulong)bVar38 * -2 + 1;
              pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar38 * -8 + 4);
            }
            uVar4 = puVar32[0x1b];
            pnVar24 = (pSVar8->theCoUbound->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar20;
            uVar10 = *(undefined8 *)(puVar32 + 0x1d);
            uVar17 = puVar32[0x1c];
            (pnVar24->m_backend).data._M_elems[0] = uVar3;
            pcVar31 = &result.m_backend;
            puVar32 = (pnVar24->m_backend).data._M_elems + 1;
            for (; lVar26 != 0; lVar26 = lVar26 + -1) {
              *puVar32 = (pcVar31->data)._M_elems[0];
              pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar38 * -8 + 4);
              puVar32 = puVar32 + (ulong)bVar38 * -2 + 1;
            }
            (pnVar24->m_backend).exp = uVar4;
            (pnVar24->m_backend).neg = (bool)((uVar3 != 0 || (int)uVar10 != 0) ^ (byte)uVar17);
            (pnVar24->m_backend).fpclass = (int)uVar10;
            (pnVar24->m_backend).prec_elem = (int)((ulong)uVar10 >> 0x20);
            pdVar21 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      (&result.m_backend,-*pdVar21,(type *)0x0);
            pnVar24 = (((this->
                        super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .thesolver)->theCoLbound->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar31 = &result.m_backend;
            pnVar30 = pnVar24 + lVar20;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pnVar30->m_backend).data._M_elems[0] = (pcVar31->data)._M_elems[0];
              pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar38 * -8 + 4);
              pnVar30 = (pointer)((long)pnVar30 + ((ulong)bVar38 * -2 + 1) * 4);
            }
            pnVar24[lVar20].m_backend.exp = result.m_backend.exp;
            pnVar24[lVar20].m_backend.neg = result.m_backend.neg;
            pnVar24[lVar20].m_backend.fpclass = result.m_backend.fpclass;
            pnVar24[lVar20].m_backend.prec_elem = result.m_backend.prec_elem;
            pVVar23 = ((this->
                       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .thesolver)->theCoUbound;
            goto LAB_0045b086;
          }
          local_f7c = local_f7c + 1;
          pSVar25 = pSVar8->spxout;
          if ((pSVar25 != (SPxOut *)0x0) && (0 < (int)pSVar25->m_verbosity)) {
            result.m_backend.data._M_elems[0] = pSVar25->m_verbosity;
            baseId.super_DataKey.info = 1;
            (*pSVar25->_vptr_SPxOut[2])(pSVar25,&baseId);
            pSVar25 = soplex::operator<<(((this->
                                          super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ).
                                          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         .thesolver)->spxout,"COPVEC unexpected status: ");
            pSVar25 = soplex::operator<<(pSVar25,SVar2);
            pSVar25 = soplex::operator<<(pSVar25," index: ");
            pSVar25 = soplex::operator<<(pSVar25,iVar1);
            pSVar25 = soplex::operator<<(pSVar25," val: ");
            pnVar24 = (((this->
                        super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .thesolver)->theCoPvec->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar30 = pnVar24 + lVar20;
            pnVar34 = &local_5b0;
            for (lVar26 = lVar27; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pnVar34->m_backend).data._M_elems[0] = *(uint *)&pnVar30->m_backend;
              pnVar30 = (pointer)((long)pnVar30 + ((ulong)bVar38 * -2 + 1) * 4);
              pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar34 + ((ulong)bVar38 * -2 + 1) * 4);
            }
            local_5b0.m_backend.exp = pnVar24[lVar20].m_backend.exp;
            local_5b0.m_backend.neg = pnVar24[lVar20].m_backend.neg;
            local_5b0.m_backend.fpclass = pnVar24[lVar20].m_backend.fpclass;
            local_5b0.m_backend.prec_elem = pnVar24[lVar20].m_backend.prec_elem;
            pSVar25 = soplex::operator<<(pSVar25,&local_5b0);
            pSVar25 = soplex::operator<<(pSVar25," upd: ");
            SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::operator[](&local_130,
                         &((this->
                           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .thesolver)->theCoPvec->thedelta,iVar1);
            pSVar25 = soplex::operator<<(pSVar25,&local_130);
            pSVar25 = soplex::operator<<(pSVar25," lower: ");
            pcVar31 = &local_e48;
            pnVar34 = &local_630;
            for (lVar26 = lVar27; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pnVar34->m_backend).data._M_elems[0] = (pcVar31->data)._M_elems[0];
              pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar31 + ((ulong)bVar38 * -2 + 1) * 4);
              pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar34 + ((ulong)bVar38 * -2 + 1) * 4);
            }
            local_630.m_backend.exp = local_e48.exp;
            local_630.m_backend.neg = local_e48.neg;
            local_630.m_backend.fpclass = local_e48.fpclass;
            local_630.m_backend.prec_elem = local_e48.prec_elem;
            pSVar25 = soplex::operator<<(pSVar25,&local_630);
            pSVar25 = soplex::operator<<(pSVar25," upper: ");
            pcVar31 = &local_dc8;
            pnVar34 = &local_6b0;
            for (lVar26 = lVar27; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pnVar34->m_backend).data._M_elems[0] = (pcVar31->data)._M_elems[0];
              pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar31 + ((ulong)bVar38 * -2 + 1) * 4);
              pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar34 + ((ulong)bVar38 * -2 + 1) * 4);
            }
            local_6b0.m_backend.exp = local_dc8.exp;
            local_6b0.m_backend.neg = local_dc8.neg;
            local_6b0.m_backend.fpclass = local_dc8.fpclass;
            local_6b0.m_backend.prec_elem = local_dc8.prec_elem;
            pSVar25 = soplex::operator<<(pSVar25,&local_6b0);
            pSVar25 = soplex::operator<<(pSVar25," bp.val: ");
            pBVar13 = (this->breakpoints).data.
                      super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar32 = (uint *)((long)(pBVar13->val).m_backend.data._M_elems + lVar36);
            pnVar34 = &local_730;
            for (; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pnVar34->m_backend).data._M_elems[0] = *puVar32;
              puVar32 = puVar32 + (ulong)bVar38 * -2 + 1;
              pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar34 + ((ulong)bVar38 * -2 + 1) * 4);
            }
            local_730.m_backend.exp = *(int *)((long)(&(pBVar13->val).m_backend.data + 1) + lVar36);
            local_730.m_backend.neg =
                 *(bool *)((long)(&(pBVar13->val).m_backend.data + 1) + lVar36 + 4U);
            local_730.m_backend._120_8_ =
                 *(undefined8 *)((long)(&(pBVar13->val).m_backend.data + 1) + lVar36 + 8U);
            pSVar25 = soplex::operator<<(pSVar25,&local_730);
            std::endl<char,std::char_traits<char>>(pSVar25->m_streams[pSVar25->m_verbosity]);
            pSVar25 = ((this->
                       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .thesolver)->spxout;
            (*pSVar25->_vptr_SPxOut[2])(pSVar25,&result);
          }
        }
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&result.m_backend,
                     &((this->
                       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .thesolver)->theCoPvec->thedelta,iVar1);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&result.m_backend,this_00,iVar1);
        result_4.m_backend.fpclass = cpp_dec_float_finite;
        result_4.m_backend.prec_elem = 0x1c;
        result_4.m_backend.data._M_elems[0] = 0;
        result_4.m_backend.data._M_elems[1] = 0;
        result_4.m_backend.data._M_elems[2] = 0;
        result_4.m_backend.data._M_elems[3] = 0;
        result_4.m_backend.data._M_elems[4] = 0;
        result_4.m_backend.data._M_elems[5] = 0;
        result_4.m_backend.data._M_elems[6] = 0;
        result_4.m_backend.data._M_elems[7] = 0;
        result_4.m_backend.data._M_elems[8] = 0;
        result_4.m_backend.data._M_elems[9] = 0;
        result_4.m_backend.data._M_elems[10] = 0;
        result_4.m_backend.data._M_elems[0xb] = 0;
        result_4.m_backend.data._M_elems[0xc] = 0;
        result_4.m_backend.data._M_elems[0xd] = 0;
        result_4.m_backend.data._M_elems[0xe] = 0;
        result_4.m_backend.data._M_elems[0xf] = 0;
        result_4.m_backend.data._M_elems[0x10] = 0;
        result_4.m_backend.data._M_elems[0x11] = 0;
        result_4.m_backend.data._M_elems[0x12] = 0;
        result_4.m_backend.data._M_elems[0x13] = 0;
        result_4.m_backend.data._M_elems[0x14] = 0;
        result_4.m_backend.data._M_elems[0x15] = 0;
        result_4.m_backend.data._M_elems[0x16] = 0;
        result_4.m_backend.data._M_elems[0x17] = 0;
        result_4.m_backend.data._M_elems[0x18] = 0;
        result_4.m_backend.data._M_elems[0x19] = 0;
        result_4.m_backend.data._M_elems._104_5_ = 0;
        result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_4.m_backend.exp = 0;
        result_4.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_4.m_backend,&result.m_backend,&local_ec8);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setValue(this_00,iVar1,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&result_4.m_backend);
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        tVar18 = boost::multiprecision::operator!=
                           ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_d38,(double *)&result.m_backend);
        lVar26 = local_ef0;
        if (tVar18) {
          pSVar8 = (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .thesolver;
          pcVar31 = &local_d38;
          pnVar34 = &local_7b0;
          for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
            (pnVar34->m_backend).data._M_elems[0] = (pcVar31->data)._M_elems[0];
            pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar31 + ((ulong)bVar38 * -2 + 1) * 4);
            pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar34 + ((ulong)bVar38 * -2 + 1) * 4);
          }
          local_7b0.m_backend.exp = local_d38.exp;
          local_7b0.m_backend.neg = local_d38.neg;
          local_7b0.m_backend.fpclass = local_d38.fpclass;
          local_7b0.m_backend.prec_elem = local_d38.prec_elem;
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::updateNonbasicValue(pSVar8,&local_7b0);
          lVar26 = local_ef0;
        }
      }
      else {
        lVar26 = local_ef0;
        if (iVar19 != 0) goto LAB_0045bc2f;
        pDVar9 = (pSVar8->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thedesc.stat;
        SVar2 = pDVar9->data[lVar20];
        pSVar8 = (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .thesolver;
        pnVar24 = (pSVar8->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar30 = pnVar24 + lVar20;
        pcVar31 = &local_dc8;
        for (lVar26 = lVar27; lVar26 != 0; lVar26 = lVar26 + -1) {
          (pcVar31->data)._M_elems[0] = (pnVar30->m_backend).data._M_elems[0];
          pnVar30 = (pointer)((long)pnVar30 + ((ulong)bVar38 * -2 + 1) * 4);
          pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar38 * -8 + 4);
        }
        local_dc8.exp = pnVar24[lVar20].m_backend.exp;
        local_dc8.neg = pnVar24[lVar20].m_backend.neg;
        local_dc8.fpclass = pnVar24[lVar20].m_backend.fpclass;
        local_dc8.prec_elem = pnVar24[lVar20].m_backend.prec_elem;
        pnVar24 = (pSVar8->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .low.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar30 = pnVar24 + lVar20;
        pcVar31 = &local_e48;
        for (lVar26 = lVar27; lVar26 != 0; lVar26 = lVar26 + -1) {
          (pcVar31->data)._M_elems[0] = (pnVar30->m_backend).data._M_elems[0];
          pnVar30 = (pointer)((long)pnVar30 + ((ulong)bVar38 * -2 + 1) * 4);
          pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar38 * -8 + 4);
        }
        local_e48.exp = pnVar24[lVar20].m_backend.exp;
        local_e48.neg = pnVar24[lVar20].m_backend.neg;
        local_e48.fpclass = pnVar24[lVar20].m_backend.fpclass;
        local_e48.prec_elem = pnVar24[lVar20].m_backend.prec_elem;
        if (SVar2 == P_ON_LOWER) {
          pDVar9->data[lVar20] = P_ON_UPPER;
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 0x1c;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems[6] = 0;
          result.m_backend.data._M_elems[7] = 0;
          result.m_backend.data._M_elems[8] = 0;
          result.m_backend.data._M_elems[9] = 0;
          result.m_backend.data._M_elems[10] = 0;
          result.m_backend.data._M_elems[0xb] = 0;
          result.m_backend.data._M_elems[0xc] = 0;
          result.m_backend.data._M_elems[0xd] = 0;
          result.m_backend.data._M_elems[0xe] = 0;
          result.m_backend.data._M_elems[0xf] = 0;
          result.m_backend.data._M_elems[0x10] = 0;
          result.m_backend.data._M_elems[0x11] = 0;
          result.m_backend.data._M_elems[0x12] = 0;
          result.m_backend.data._M_elems[0x13] = 0;
          result.m_backend.data._M_elems[0x14] = 0;
          result.m_backend.data._M_elems[0x15] = 0;
          result.m_backend.data._M_elems[0x16] = 0;
          result.m_backend.data._M_elems[0x17] = 0;
          result.m_backend.data._M_elems[0x18] = 0;
          result.m_backend.data._M_elems[0x19] = 0;
          result.m_backend.data._M_elems._104_5_ = 0;
          result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result.m_backend,&local_dc8,&local_e48);
          pcVar31 = &result.m_backend;
          pcVar33 = &local_ec8;
          for (lVar26 = lVar27; lVar26 != 0; lVar26 = lVar26 + -1) {
            (pcVar33->data)._M_elems[0] = (pcVar31->data)._M_elems[0];
            pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar38 * -8 + 4);
            pcVar33 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar33 + (ulong)bVar38 * -8 + 4);
          }
          local_ec8.exp = result.m_backend.exp;
          local_ec8.neg = result.m_backend.neg;
          local_ec8.fpclass = result.m_backend.fpclass;
          local_ec8.prec_elem = result.m_backend.prec_elem;
          pSVar8 = (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .thesolver;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                    (&(pSVar8->theUbound->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar20].m_backend,
                     &(pSVar8->theLbound->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar20].m_backend);
          pdVar21 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (&result.m_backend,-*pdVar21,(type *)0x0);
          pnVar24 = (((this->
                      super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .thesolver)->theLbound->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pcVar31 = &result.m_backend;
          pnVar30 = pnVar24 + lVar20;
          for (lVar26 = lVar27; lVar26 != 0; lVar26 = lVar26 + -1) {
            (pnVar30->m_backend).data._M_elems[0] = (pcVar31->data)._M_elems[0];
            pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar38 * -8 + 4);
            pnVar30 = (pointer)((long)pnVar30 + ((ulong)bVar38 * -2 + 1) * 4);
          }
          pnVar24[lVar20].m_backend.exp = result.m_backend.exp;
          pnVar24[lVar20].m_backend.neg = result.m_backend.neg;
          pnVar24[lVar20].m_backend.fpclass = result.m_backend.fpclass;
          pnVar24[lVar20].m_backend.prec_elem = result.m_backend.prec_elem;
          pVVar23 = ((this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .thesolver)->theUbound;
LAB_0045b42d:
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 0x1c;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems[6] = 0;
          result.m_backend.data._M_elems[7] = 0;
          result.m_backend.data._M_elems[8] = 0;
          result.m_backend.data._M_elems[9] = 0;
          result.m_backend.data._M_elems[10] = 0;
          result.m_backend.data._M_elems[0xb] = 0;
          result.m_backend.data._M_elems[0xc] = 0;
          result.m_backend.data._M_elems[0xd] = 0;
          result.m_backend.data._M_elems[0xe] = 0;
          result.m_backend.data._M_elems[0xf] = 0;
          result.m_backend.data._M_elems[0x10] = 0;
          result.m_backend.data._M_elems[0x11] = 0;
          result.m_backend.data._M_elems[0x12] = 0;
          result.m_backend.data._M_elems[0x13] = 0;
          result.m_backend.data._M_elems[0x14] = 0;
          result.m_backend.data._M_elems[0x15] = 0;
          result.m_backend.data._M_elems[0x16] = 0;
          result.m_backend.data._M_elems[0x17] = 0;
          result.m_backend.data._M_elems[0x18] = 0;
          result.m_backend.data._M_elems[0x19] = 0;
          result.m_backend.data._M_elems._104_5_ = 0;
          result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result.m_backend,&local_ec8,
                     &(pVVar23->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar20].m_backend);
          pcVar31 = &result.m_backend;
          pcVar33 = &local_d38;
          for (; lVar27 != 0; lVar27 = lVar27 + -1) {
            (pcVar33->data)._M_elems[0] = (pcVar31->data)._M_elems[0];
            pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar38 * -8 + 4);
            pcVar33 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar33 + ((ulong)bVar38 * -2 + 1) * 4);
          }
          local_d38.exp = result.m_backend.exp;
          local_d38.neg = result.m_backend.neg;
          local_d38.fpclass = result.m_backend.fpclass;
          local_d38.prec_elem = result.m_backend.prec_elem;
        }
        else {
          if (SVar2 == P_ON_UPPER) {
            pDVar9->data[lVar20] = P_ON_LOWER;
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 0x1c;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems[8] = 0;
            result.m_backend.data._M_elems[9] = 0;
            result.m_backend.data._M_elems[10] = 0;
            result.m_backend.data._M_elems[0xb] = 0;
            result.m_backend.data._M_elems[0xc] = 0;
            result.m_backend.data._M_elems[0xd] = 0;
            result.m_backend.data._M_elems[0xe] = 0;
            result.m_backend.data._M_elems[0xf] = 0;
            result.m_backend.data._M_elems[0x10] = 0;
            result.m_backend.data._M_elems[0x11] = 0;
            result.m_backend.data._M_elems[0x12] = 0;
            result.m_backend.data._M_elems[0x13] = 0;
            result.m_backend.data._M_elems[0x14] = 0;
            result.m_backend.data._M_elems[0x15] = 0;
            result.m_backend.data._M_elems[0x16] = 0;
            result.m_backend.data._M_elems[0x17] = 0;
            result.m_backend.data._M_elems[0x18] = 0;
            result.m_backend.data._M_elems[0x19] = 0;
            result.m_backend.data._M_elems._104_5_ = 0;
            result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result.m_backend,&local_e48,&local_dc8);
            pcVar31 = &result.m_backend;
            pcVar33 = &local_ec8;
            for (lVar26 = lVar27; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pcVar33->data)._M_elems[0] = (pcVar31->data)._M_elems[0];
              pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar38 * -8 + 4);
              pcVar33 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar33 + (ulong)bVar38 * -8 + 4);
            }
            local_ec8.exp = result.m_backend.exp;
            local_ec8.neg = result.m_backend.neg;
            local_ec8.fpclass = result.m_backend.fpclass;
            local_ec8.prec_elem = result.m_backend.prec_elem;
            pSVar8 = (this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .thesolver;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                      (&(pSVar8->theLbound->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar20].m_backend,
                       &(pSVar8->theUbound->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar20].m_backend);
            pdVar21 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      (&result.m_backend,*pdVar21,(type *)0x0);
            pnVar24 = (((this->
                        super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .thesolver)->theUbound->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar31 = &result.m_backend;
            pnVar30 = pnVar24 + lVar20;
            for (lVar26 = lVar27; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pnVar30->m_backend).data._M_elems[0] = (pcVar31->data)._M_elems[0];
              pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar38 * -8 + 4);
              pnVar30 = (pointer)((long)pnVar30 + ((ulong)bVar38 * -2 + 1) * 4);
            }
            pnVar24[lVar20].m_backend.exp = result.m_backend.exp;
            pnVar24[lVar20].m_backend.neg = result.m_backend.neg;
            pnVar24[lVar20].m_backend.fpclass = result.m_backend.fpclass;
            pnVar24[lVar20].m_backend.prec_elem = result.m_backend.prec_elem;
            pVVar23 = ((this->
                       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .thesolver)->theLbound;
            goto LAB_0045b42d;
          }
          local_f7c = local_f7c + 1;
          pSVar25 = pSVar8->spxout;
          if ((pSVar25 != (SPxOut *)0x0) && (0 < (int)pSVar25->m_verbosity)) {
            result.m_backend.data._M_elems[0] = pSVar25->m_verbosity;
            baseId.super_DataKey.info = 1;
            (*pSVar25->_vptr_SPxOut[2])(pSVar25,&baseId);
            pSVar25 = soplex::operator<<(((this->
                                          super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ).
                                          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         .thesolver)->spxout,"PVEC unexpected status: ");
            pSVar25 = soplex::operator<<(pSVar25,SVar2);
            pSVar25 = soplex::operator<<(pSVar25," index: ");
            pSVar25 = soplex::operator<<(pSVar25,iVar1);
            pSVar25 = soplex::operator<<(pSVar25," val: ");
            pnVar24 = (((this->
                        super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .thesolver)->thePvec->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar26 = 0x1c;
            pnVar30 = pnVar24 + lVar20;
            pnVar34 = &local_2b0;
            for (lVar27 = lVar26; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pnVar34->m_backend).data._M_elems[0] = *(uint *)&pnVar30->m_backend;
              pnVar30 = (pointer)((long)pnVar30 + ((ulong)bVar38 * -2 + 1) * 4);
              pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar34 + ((ulong)bVar38 * -2 + 1) * 4);
            }
            local_2b0.m_backend.exp = pnVar24[lVar20].m_backend.exp;
            local_2b0.m_backend.neg = pnVar24[lVar20].m_backend.neg;
            local_2b0.m_backend.fpclass = pnVar24[lVar20].m_backend.fpclass;
            local_2b0.m_backend.prec_elem = pnVar24[lVar20].m_backend.prec_elem;
            pSVar25 = soplex::operator<<(pSVar25,&local_2b0);
            pSVar25 = soplex::operator<<(pSVar25," upd: ");
            SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::operator[](&local_b0,
                         &((this->
                           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .thesolver)->thePvec->thedelta,iVar1);
            pSVar25 = soplex::operator<<(pSVar25,&local_b0);
            pSVar25 = soplex::operator<<(pSVar25," lower: ");
            pcVar31 = &local_e48;
            pnVar34 = &local_330;
            for (lVar27 = lVar26; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pnVar34->m_backend).data._M_elems[0] = (pcVar31->data)._M_elems[0];
              pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar31 + ((ulong)bVar38 * -2 + 1) * 4);
              pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar34 + ((ulong)bVar38 * -2 + 1) * 4);
            }
            local_330.m_backend.exp = local_e48.exp;
            local_330.m_backend.neg = local_e48.neg;
            local_330.m_backend.fpclass = local_e48.fpclass;
            local_330.m_backend.prec_elem = local_e48.prec_elem;
            pSVar25 = soplex::operator<<(pSVar25,&local_330);
            pSVar25 = soplex::operator<<(pSVar25," upper: ");
            pcVar31 = &local_dc8;
            pnVar34 = &local_3b0;
            for (lVar27 = lVar26; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pnVar34->m_backend).data._M_elems[0] = (pcVar31->data)._M_elems[0];
              pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar31 + ((ulong)bVar38 * -2 + 1) * 4);
              pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar34 + ((ulong)bVar38 * -2 + 1) * 4);
            }
            local_3b0.m_backend.exp = local_dc8.exp;
            local_3b0.m_backend.neg = local_dc8.neg;
            local_3b0.m_backend.fpclass = local_dc8.fpclass;
            local_3b0.m_backend.prec_elem = local_dc8.prec_elem;
            pSVar25 = soplex::operator<<(pSVar25,&local_3b0);
            pSVar25 = soplex::operator<<(pSVar25," bp.val: ");
            pBVar13 = (this->breakpoints).data.
                      super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar32 = (uint *)((long)(pBVar13->val).m_backend.data._M_elems + lVar36);
            pnVar34 = &local_430;
            for (; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pnVar34->m_backend).data._M_elems[0] = *puVar32;
              puVar32 = puVar32 + (ulong)bVar38 * -2 + 1;
              pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar34 + ((ulong)bVar38 * -2 + 1) * 4);
            }
            local_430.m_backend.exp = *(int *)((long)(&(pBVar13->val).m_backend.data + 1) + lVar36);
            local_430.m_backend.neg =
                 *(bool *)((long)(&(pBVar13->val).m_backend.data + 1) + lVar36 + 4U);
            local_430.m_backend._120_8_ =
                 *(undefined8 *)((long)(&(pBVar13->val).m_backend.data + 1) + lVar36 + 8U);
            pSVar25 = soplex::operator<<(pSVar25,&local_430);
            std::endl<char,std::char_traits<char>>(pSVar25->m_streams[pSVar25->m_verbosity]);
            pSVar25 = ((this->
                       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .thesolver)->spxout;
            (*pSVar25->_vptr_SPxOut[2])(pSVar25,&result);
          }
        }
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[](&result,&((this->
                               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .thesolver)->thePvec->thedelta,iVar1);
        pSVar8 = (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .thesolver;
        lVar27 = 0x1c;
        pcVar31 = &local_ec8;
        pnVar34 = &local_4b0;
        for (lVar26 = lVar27; lVar26 != 0; lVar26 = lVar26 + -1) {
          (pnVar34->m_backend).data._M_elems[0] = (pcVar31->data)._M_elems[0];
          pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + ((ulong)bVar38 * -2 + 1) * 4)
          ;
          pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar34 + ((ulong)bVar38 * -2 + 1) * 4);
        }
        local_4b0.m_backend.exp = local_ec8.exp;
        local_4b0.m_backend.neg = local_ec8.neg;
        local_4b0.m_backend.fpclass = local_ec8.fpclass;
        local_4b0.m_backend.prec_elem = local_ec8.prec_elem;
        pSVar12 = pSVar8->thevectors;
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::
        multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    *)this_00,&local_4b0,
                   (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)((pSVar12->set).theitem + (pSVar12->set).thekey[lVar20].idx));
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        tVar18 = boost::multiprecision::operator!=
                           ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_d38,(double *)&result);
        lVar26 = local_ef0;
        if (tVar18) {
          pSVar8 = (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .thesolver;
          pcVar31 = &local_d38;
          pnVar34 = &local_530;
          for (; lVar27 != 0; lVar27 = lVar27 + -1) {
            (pnVar34->m_backend).data._M_elems[0] =
                 (((cpp_dec_float<200U,_int,_void> *)&pcVar31->data)->data)._M_elems[0];
            pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar31 + ((ulong)bVar38 * -2 + 1) * 4);
            pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar34 + ((ulong)bVar38 * -2 + 1) * 4);
          }
          local_530.m_backend.exp = local_d38.exp;
          local_530.m_backend.neg = local_d38.neg;
          local_530.m_backend.fpclass = local_d38.fpclass;
          local_530.m_backend.prec_elem = local_d38.prec_elem;
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::updateNonbasicValue(pSVar8,&local_530);
          lVar26 = local_ef0;
        }
      }
    }
LAB_0045bc2f:
    lVar26 = lVar26 + 1;
    lVar36 = lVar36 + 0x88;
  } while( true );
}

Assistant:

void SPxBoundFlippingRT<R>::flipAndUpdate(
   int&                  nflips              /**< number of bounds that should be flipped */
)
{
   assert(nflips > 0);

   // number of bound flips that are not performed
   int skipped;

   updPrimRhs.setup();
   updPrimRhs.reDim(this->thesolver->dim());
   updPrimVec.reDim(this->thesolver->dim());
   updPrimRhs.clear();
   updPrimVec.clear();

   skipped = 0;

   for(int i = 0; i < nflips; ++i)
   {
      int idx;
      idx = breakpoints[i].idx;

      if(idx < 0)
      {
         ++skipped;
         continue;
      }

      R range;
      R upper;
      R lower;
      R objChange = 0.0;
      typename SPxBasisBase<R>::Desc::Status stat;
      typename SPxBasisBase<R>::Desc& ds = this->thesolver->basis().desc();

      range = 0;

      if(breakpoints[i].src == PVEC)
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::COLUMN);
         stat = ds.status(idx);
         upper = this->thesolver->upper(idx);
         lower = this->thesolver->lower(idx);

         switch(stat)
         {
         case SPxBasisBase<R>::Desc::P_ON_UPPER :
            ds.status(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            range = lower - upper;
            assert((*this->thesolver->theLbound)[idx] == R(-infinity));
            (*this->thesolver->theLbound)[idx] = (*this->thesolver->theUbound)[idx];
            (*this->thesolver->theUbound)[idx] = R(infinity);
            objChange = range * (*this->thesolver->theLbound)[idx];
            break;

         case SPxBasisBase<R>::Desc::P_ON_LOWER :
            ds.status(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            range = upper - lower;
            assert((*this->thesolver->theUbound)[idx] == R(infinity));
            (*this->thesolver->theUbound)[idx] = (*this->thesolver->theLbound)[idx];
            (*this->thesolver->theLbound)[idx] = R(-infinity);
            objChange = range * (*this->thesolver->theUbound)[idx];
            break;

         default :
            ++skipped;
            SPX_MSG_WARNING((*this->thesolver->spxout),
                            (*this->thesolver->spxout) << "PVEC unexpected status: " << static_cast<int>(stat)
                            << " index: " << idx
                            << " val: " << this->thesolver->pVec()[idx]
                            << " upd: " << this->thesolver->pVec().delta()[idx]
                            << " lower: " << lower
                            << " upper: " << upper
                            << " bp.val: " << breakpoints[i].val
                            << std::endl;)
         }

         SPxOut::debug(this,
                       "PVEC flipped from: {} index: {} val: {} upd: {} lower: {} upper: {} bp.val: {} UCbound: {} LCbound: {}\n",
                       stat, idx, this->thesolver->pVec()[idx], this->thesolver->pVec().delta()[idx], lower, upper,
                       breakpoints[i].val, this->thesolver->theUCbound[idx], this->thesolver->theLCbound[idx]);
         assert(spxAbs(range) < 1e20);
         updPrimRhs.multAdd(range, this->thesolver->vector(idx));

         if(objChange != 0.0)
            this->thesolver->updateNonbasicValue(objChange);
      }
      else if(breakpoints[i].src == COPVEC)
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::COLUMN);
         stat = ds.coStatus(idx);
         upper = this->thesolver->rhs(idx);
         lower = this->thesolver->lhs(idx);

         switch(stat)
         {
         case SPxBasisBase<R>::Desc::P_ON_UPPER :
            ds.coStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            range = lower - upper;
            assert((*this->thesolver->theCoUbound)[idx] == R(infinity));
            (*this->thesolver->theCoUbound)[idx] = -(*this->thesolver->theCoLbound)[idx];
            (*this->thesolver->theCoLbound)[idx] = R(-infinity);
            objChange = range * (*this->thesolver->theCoUbound)[idx];
            break;

         case SPxBasisBase<R>::Desc::P_ON_LOWER :
            ds.coStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            range = upper - lower;
            assert((*this->thesolver->theCoLbound)[idx] == R(-infinity));
            (*this->thesolver->theCoLbound)[idx] = -(*this->thesolver->theCoUbound)[idx];
            (*this->thesolver->theCoUbound)[idx] = R(infinity);
            objChange = range * (*this->thesolver->theCoLbound)[idx];
            break;

         default :
            ++skipped;
            SPX_MSG_WARNING((*this->thesolver->spxout),
                            (*this->thesolver->spxout) << "COPVEC unexpected status: " << static_cast<int>(stat)
                            << " index: " << idx
                            << " val: " << this->thesolver->coPvec()[idx]
                            << " upd: " << this->thesolver->coPvec().delta()[idx]
                            << " lower: " << lower
                            << " upper: " << upper
                            << " bp.val: " << breakpoints[i].val
                            << std::endl;)
         }

         SPxOut::debug(this,
                       "COPVEC flipped from: {} index: {} val: {} upd: {} lower: {} upper: {} bp.val: {} URbound: {} LRbound: {}\n",
                       stat, idx, this->thesolver->coPvec()[idx], this->thesolver->coPvec().delta()[idx], lower, upper,
                       breakpoints[i].val, this->thesolver->theURbound[idx], this->thesolver->theLRbound[idx]);
         assert(spxAbs(range) < 1e20);
         updPrimRhs.setValue(idx, updPrimRhs[idx] - range);

         if(objChange != 0.0)
            this->thesolver->updateNonbasicValue(objChange);
      }
      else if(breakpoints[i].src == FVEC)
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::ROW);
         SPxId baseId = this->thesolver->basis().baseId(idx);
         int IdNumber;

         if(baseId.isSPxRowId())
         {
            IdNumber = this->thesolver->number(SPxRowId(baseId));
            stat = ds.rowStatus(IdNumber);
            upper = this->thesolver->rhs(IdNumber);
            lower = this->thesolver->lhs(IdNumber);

            switch(stat)
            {
            case SPxBasisBase<R>::Desc::P_ON_UPPER :
               ds.rowStatus(IdNumber) = SPxBasisBase<R>::Desc::P_ON_LOWER;
               range = upper - lower;
               assert(this->thesolver->theUBbound[idx] == R(infinity));
               this->thesolver->theUBbound[idx] = -this->thesolver->theLBbound[idx];
               this->thesolver->theLBbound[idx] = R(-infinity);
               break;

            case SPxBasisBase<R>::Desc::P_ON_LOWER :
               ds.rowStatus(IdNumber) = SPxBasisBase<R>::Desc::P_ON_UPPER;
               range = lower - upper;
               assert(this->thesolver->theLBbound[idx] == R(-infinity));
               this->thesolver->theLBbound[idx] = -this->thesolver->theUBbound[idx];
               this->thesolver->theUBbound[idx] = R(infinity);
               break;

            default :
               ++skipped;
               SPX_MSG_WARNING((*this->thesolver->spxout),
                               (*this->thesolver->spxout) << "unexpected basis status: " << static_cast<int>(stat)
                               << " index: " << idx
                               << " val: " << this->thesolver->fVec()[idx]
                               << " upd: " << this->thesolver->fVec().delta()[idx]
                               << " lower: " << lower
                               << " upper: " << upper
                               << " bp.val: " << breakpoints[i].val
                               << std::endl;)
            }
         }
         else
         {
            assert(baseId.isSPxColId());
            IdNumber = this->thesolver->number(SPxColId(baseId));
            stat = ds.colStatus(IdNumber);
            upper = this->thesolver->upper(IdNumber);
            lower = this->thesolver->lower(IdNumber);

            switch(stat)
            {
            case SPxBasisBase<R>::Desc::P_ON_UPPER :
               ds.colStatus(IdNumber) = SPxBasisBase<R>::Desc::P_ON_LOWER;
               range = upper - lower;
               assert(this->thesolver->theUBbound[idx] == R(infinity));
               this->thesolver->theUBbound[idx] = -this->thesolver->theLBbound[idx];
               this->thesolver->theLBbound[idx] = R(-infinity);
               break;

            case SPxBasisBase<R>::Desc::P_ON_LOWER :
               ds.colStatus(IdNumber) = SPxBasisBase<R>::Desc::P_ON_UPPER;
               range = lower - upper;
               assert(this->thesolver->theLBbound[idx] == R(-infinity));
               this->thesolver->theLBbound[idx] = -this->thesolver->theUBbound[idx];
               this->thesolver->theUBbound[idx] = R(infinity);
               break;

            default :
               ++skipped;
               SPX_MSG_WARNING((*this->thesolver->spxout),
                               (*this->thesolver->spxout) << "FVEC unexpected status: " << static_cast<int>(stat)
                               << " index: " << idx
                               << " val: " << this->thesolver->fVec()[idx]
                               << " upd: " << this->thesolver->fVec().delta()[idx]
                               << " lower: " << lower
                               << " upper: " << upper
                               << " bp.val: " << breakpoints[i].val
                               << std::endl;)
            }
         }

         SPxOut::debug(this,
                       "basic row/col flipped from: {} index: {} val: {} upd: {} lower: {} upper: {} bp.val: {} \n",
                       stat, idx, this->thesolver->fVec()[idx], this->thesolver->fVec().delta()[idx], lower, upper,
                       breakpoints[i].val);
         assert(spxAbs(range) < 1e20);
         assert(updPrimRhs[idx] == 0);
         updPrimRhs.add(idx, range);
      }
   }

   nflips -= skipped;

   if(nflips > 0)
   {
      if(this->thesolver->rep() == SPxSolverBase<R>::ROW)
      {
         assert(this->m_type == SPxSolverBase<R>::ENTER);
         (*this->thesolver->theCoPrhs) -= updPrimRhs;
         this->thesolver->setup4coSolve2(&updPrimVec, &updPrimRhs);
      }
      else
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::COLUMN);
         assert(this->m_type == SPxSolverBase<R>::LEAVE);
         (*this->thesolver->theFrhs) -= updPrimRhs;
         this->thesolver->setup4solve2(&updPrimVec, &updPrimRhs);
      }
   }

   return;
}